

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewWidget.cpp
# Opt level: O3

void __thiscall KDReports::PreviewWidgetPrivate::setupComboBoxes(PreviewWidgetPrivate *this)

{
  QComboBox *pQVar1;
  uint uVar2;
  undefined1 auStack_78 [24];
  QArrayDataPointer<char16_t> local_60;
  QVariant local_48;
  QIcon local_28;
  
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e08);
  QVariant::QVariant(&local_48,3);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e1b);
  QVariant::QVariant(&local_48,4);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e2d);
  QVariant::QVariant(&local_48,5);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e3f);
  QVariant::QVariant(&local_48,6);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e51);
  QVariant::QVariant(&local_48,7);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e63);
  QVariant::QVariant(&local_48,8);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e75);
  QVariant::QVariant(&local_48,9);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e87);
  QVariant::QVariant(&local_48,10);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157e98);
  QVariant::QVariant(&local_48,0xb);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157ea8);
  QVariant::QVariant(&local_48,0xe);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157ebc);
  QVariant::QVariant(&local_48,0xf);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157ecf);
  QVariant::QVariant(&local_48,0x10);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157ee1);
  QVariant::QVariant(&local_48,0x11);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157ef3);
  QVariant::QVariant(&local_48,0x12);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f05);
  QVariant::QVariant(&local_48,0x13);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f17);
  QVariant::QVariant(&local_48,0x14);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f29);
  QVariant::QVariant(&local_48,0x15);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f3a);
  QVariant::QVariant(&local_48,0x16);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f4a);
  QVariant::QVariant(&local_48,0x19);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f5d);
  QVariant::QVariant(&local_48,0x1b);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f70);
  QVariant::QVariant(&local_48,2);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157f8c);
  QVariant::QVariant(&local_48,0x1c);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157fa1);
  QVariant::QVariant(&local_48,0x1d);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157fb7);
  QVariant::QVariant(&local_48,1);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157fcf);
  QVariant::QVariant(&local_48,0);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157fe8);
  QVariant::QVariant(&local_48,0x1e);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x157fff);
  QVariant::QVariant(&local_48,0x1a);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperSizeCombo;
  QMetaObject::tr(auStack_78 + 0x18,(char *)&PreviewWidget::staticMetaObject,0x15801e);
  QString::arg(this->m_endlessPrinterWidth,(int)auStack_78,(char)(auStack_78 + 0x18),0,(QChar)0x67);
  QVariant::QVariant(&local_48,0x1f);
  uVar2 = QComboBox::count();
  QIcon::QIcon(&local_28);
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)&local_28,(QVariant *)auStack_78);
  QIcon::~QIcon(&local_28);
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)(auStack_78 + 0x18));
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperOrientationCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x15803b);
  QVariant::QVariant(&local_48,0);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  pQVar1 = (this->super_PreviewWidgetBase).super_Ui_PreviewWidgetBase.paperOrientationCombo;
  QMetaObject::tr(auStack_78,(char *)&PreviewWidget::staticMetaObject,0x158044);
  QVariant::QVariant(&local_48,1);
  uVar2 = QComboBox::count();
  QIcon::QIcon((QIcon *)(auStack_78 + 0x18));
  QComboBox::insertItem
            ((int)pQVar1,(QIcon *)(ulong)uVar2,(QString *)(auStack_78 + 0x18),(QVariant *)auStack_78
            );
  QIcon::~QIcon((QIcon *)(auStack_78 + 0x18));
  QVariant::~QVariant(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_78);
  return;
}

Assistant:

void KDReports::PreviewWidgetPrivate::setupComboBoxes()
{
    paperSizeCombo->addItem(PreviewWidget::tr("A0 (841 x 1189 mm)"), QPageSize::A0);
    paperSizeCombo->addItem(PreviewWidget::tr("A1 (594 x 841 mm)"), QPageSize::A1);
    paperSizeCombo->addItem(PreviewWidget::tr("A2 (420 x 594 mm)"), QPageSize::A2);
    paperSizeCombo->addItem(PreviewWidget::tr("A3 (297 x 420 mm)"), QPageSize::A3);
    paperSizeCombo->addItem(PreviewWidget::tr("A4 (210 x 297 mm)"), QPageSize::A4);
    paperSizeCombo->addItem(PreviewWidget::tr("A5 (148 x 210 mm)"), QPageSize::A5);
    paperSizeCombo->addItem(PreviewWidget::tr("A6 (105 x 148 mm)"), QPageSize::A6);
    paperSizeCombo->addItem(PreviewWidget::tr("A7 (74 x 105 mm)"), QPageSize::A7);
    paperSizeCombo->addItem(PreviewWidget::tr("A8 (52 x 74 mm)"), QPageSize::A8);
    // paperSizeCombo->addItem(PreviewWidget::tr("A9 (37 x 52 mm)"), QPageSize::A9);
    paperSizeCombo->addItem(PreviewWidget::tr("B0 (1000 x 1414 mm)"), QPageSize::B0);
    paperSizeCombo->addItem(PreviewWidget::tr("B1 (707 x 1000 mm)"), QPageSize::B1);
    paperSizeCombo->addItem(PreviewWidget::tr("B2 (500 x 707 mm)"), QPageSize::B2);
    paperSizeCombo->addItem(PreviewWidget::tr("B3 (353 x 500 mm)"), QPageSize::B3);
    paperSizeCombo->addItem(PreviewWidget::tr("B4 (250 x 353 mm)"), QPageSize::B4);
    paperSizeCombo->addItem(PreviewWidget::tr("B5 (176 x 250 mm)"), QPageSize::B5);
    paperSizeCombo->addItem(PreviewWidget::tr("B6 (125 x 176 mm)"), QPageSize::B6);
    paperSizeCombo->addItem(PreviewWidget::tr("B7 (88 x 125 mm)"), QPageSize::B7);
    paperSizeCombo->addItem(PreviewWidget::tr("B8 (62 x 88 mm)"), QPageSize::B8);
    // paperSizeCombo->addItem(PreviewWidget::tr("B9 (44 x 62 mm)"), QPageSize::B9);
    // paperSizeCombo->addItem(PreviewWidget::tr("B10 (31 x 44 mm)"), QPageSize::B10);
    paperSizeCombo->addItem(PreviewWidget::tr("C5E (163 x 229 mm)"), QPageSize::C5E);
    paperSizeCombo->addItem(PreviewWidget::tr("DLE (110 x 220 mm)"), QPageSize::DLE);
    paperSizeCombo->addItem(PreviewWidget::tr("Executive (7.5 x 10 inches)"), QPageSize::Executive);
    paperSizeCombo->addItem(PreviewWidget::tr("Folio (210 x 330 mm)"), QPageSize::Folio);
    paperSizeCombo->addItem(PreviewWidget::tr("Ledger (432 x 279 mm)"), QPageSize::Ledger);
    paperSizeCombo->addItem(PreviewWidget::tr("Legal (8.5 x 14 inches)"), QPageSize::Legal);
    paperSizeCombo->addItem(PreviewWidget::tr("Letter (8.5 x 11 inches)"), QPageSize::Letter);
    paperSizeCombo->addItem(PreviewWidget::tr("Tabloid (279 x 432 mm)"), QPageSize::Tabloid);
    paperSizeCombo->addItem(PreviewWidget::tr("US #10 Envelope (105 x 241 mm)"), QPageSize::Comm10E);
    paperSizeCombo->addItem(PreviewWidget::tr("Endless printer (%1 mm wide)").arg(m_endlessPrinterWidth), QPageSize::Custom);

    paperOrientationCombo->addItem(PreviewWidget::tr("Portrait"), QPageLayout::Portrait);
    paperOrientationCombo->addItem(PreviewWidget::tr("Landscape"), QPageLayout::Landscape);
}